

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int64_t test_memory_compare_value(void *memory,uint8_t value,uint64_t size)

{
  byte *pbVar1;
  uint64_t i;
  uint64_t uVar2;
  
  uVar2 = 0;
  do {
    if (size == uVar2) {
      return 0;
    }
    pbVar1 = (byte *)((long)memory + uVar2);
    uVar2 = uVar2 + 1;
  } while (*pbVar1 == value);
  return (ulong)*pbVar1 - (ulong)value;
}

Assistant:

int64_t test_memory_compare_value(const void *memory,
                                  uint8_t value,
                                  uint64_t size)
{
  for (uint64_t i = 0; i < size; ++i)
  {
    uint8_t byte = (static_cast<const uint8_t *>(memory))[i];
    if (byte != value)
    {
      return byte - value;
    }
  }
  return 0;
}